

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  ulong uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCIntersectArguments *pRVar10;
  RTCRayQueryContext *pRVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 (*pauVar57) [16];
  int iVar58;
  uint uVar59;
  uint uVar60;
  long lVar61;
  ulong uVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  ulong uVar66;
  undefined4 uVar67;
  ulong unaff_R12;
  Scene *pSVar68;
  ulong uVar69;
  ulong uVar70;
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar79 [32];
  undefined1 auVar78 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  float fVar87;
  undefined1 auVar86 [32];
  float fVar88;
  float fVar98;
  float fVar99;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar102;
  float fVar104;
  float fVar106;
  undefined1 auVar94 [32];
  undefined1 auVar92 [16];
  float fVar100;
  undefined1 auVar95 [32];
  float fVar101;
  float fVar103;
  float fVar105;
  float fVar107;
  undefined1 auVar96 [32];
  undefined1 auVar93 [16];
  undefined1 auVar97 [32];
  float fVar108;
  float fVar114;
  float fVar115;
  undefined1 auVar109 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar110 [32];
  float fVar116;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar120;
  float fVar121;
  float fVar127;
  float fVar129;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar125 [32];
  float fVar128;
  float fVar130;
  undefined1 auVar126 [32];
  float fVar134;
  undefined1 auVar135 [32];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar136 [64];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  float fVar146;
  float fVar147;
  undefined1 auVar148 [32];
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar149 [64];
  float fVar162;
  undefined1 auVar163 [32];
  float fVar172;
  undefined1 auVar164 [32];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar165 [64];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  float fVar175;
  undefined1 auVar176 [32];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar177 [64];
  float fVar184;
  float fVar185;
  undefined1 auVar186 [32];
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  undefined1 auVar187 [64];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  float fVar204;
  float fVar205;
  undefined1 auVar206 [32];
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar207 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_1504;
  ulong local_1500;
  Scene *local_14f8;
  RTCFilterFunctionNArguments local_14f0;
  undefined1 local_14c0 [8];
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined1 (*local_1498) [16];
  long local_1490;
  ulong local_1488;
  ulong local_1480;
  ulong local_1478;
  float local_1470;
  float local_146c;
  float local_1468;
  undefined4 local_1464;
  undefined4 local_1460;
  undefined4 local_145c;
  uint local_1458;
  uint local_1454;
  uint local_1450;
  undefined8 local_1440;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  float local_11e0 [4];
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  undefined4 uStack_11c4;
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  undefined4 uStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  long local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_fa0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f98 = 0;
    if (local_fa0 != 8) {
      local_1498 = (undefined1 (*) [16])local_f90;
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar77 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar81 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar72._8_4_ = 0x7fffffff;
      auVar72._0_8_ = 0x7fffffff7fffffff;
      auVar72._12_4_ = 0x7fffffff;
      auVar72 = vandps_avx((undefined1  [16])aVar2,auVar72);
      auVar93._8_4_ = 0x219392ef;
      auVar93._0_8_ = 0x219392ef219392ef;
      auVar93._12_4_ = 0x219392ef;
      auVar72 = vcmpps_avx(auVar72,auVar93,1);
      auVar122._8_4_ = 0x3f800000;
      auVar122._0_8_ = &DAT_3f8000003f800000;
      auVar122._12_4_ = 0x3f800000;
      auVar93 = vdivps_avx(auVar122,(undefined1  [16])aVar2);
      auVar123._8_4_ = 0x5d5e0b6b;
      auVar123._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar123._12_4_ = 0x5d5e0b6b;
      auVar72 = vblendvps_avx(auVar93,auVar123,auVar72);
      auVar109._0_4_ = auVar72._0_4_ * 0.99999964;
      auVar109._4_4_ = auVar72._4_4_ * 0.99999964;
      auVar109._8_4_ = auVar72._8_4_ * 0.99999964;
      auVar109._12_4_ = auVar72._12_4_ * 0.99999964;
      auVar89._0_4_ = auVar72._0_4_ * 1.0000004;
      auVar89._4_4_ = auVar72._4_4_ * 1.0000004;
      auVar89._8_4_ = auVar72._8_4_ * 1.0000004;
      auVar89._12_4_ = auVar72._12_4_ * 1.0000004;
      uVar67 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_1350._4_4_ = uVar67;
      local_1350._0_4_ = uVar67;
      local_1350._8_4_ = uVar67;
      local_1350._12_4_ = uVar67;
      auVar145 = ZEXT1664(local_1350);
      uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_1360._4_4_ = uVar67;
      local_1360._0_4_ = uVar67;
      local_1360._8_4_ = uVar67;
      local_1360._12_4_ = uVar67;
      auVar149 = ZEXT1664(local_1360);
      uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_1370._4_4_ = uVar67;
      local_1370._0_4_ = uVar67;
      local_1370._8_4_ = uVar67;
      local_1370._12_4_ = uVar67;
      auVar165 = ZEXT1664(local_1370);
      local_1380 = vshufps_avx(auVar109,auVar109,0);
      auVar174 = ZEXT1664(local_1380);
      auVar72 = vmovshdup_avx(auVar109);
      local_1390 = vshufps_avx(auVar109,auVar109,0x55);
      auVar177 = ZEXT1664(local_1390);
      auVar93 = vshufpd_avx(auVar109,auVar109,1);
      local_13a0 = vshufps_avx(auVar109,auVar109,0xaa);
      auVar187 = ZEXT1664(local_13a0);
      local_13b0 = vshufps_avx(auVar89,auVar89,0);
      auVar201 = ZEXT1664(local_13b0);
      local_13c0 = vshufps_avx(auVar89,auVar89,0x55);
      auVar203 = ZEXT1664(local_13c0);
      local_13d0 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar207 = ZEXT1664(local_13d0);
      uVar62 = (ulong)(auVar109._0_4_ < 0.0) * 0x10;
      uVar65 = (ulong)(auVar72._0_4_ < 0.0) << 4 | 0x20;
      uVar66 = (ulong)(auVar93._0_4_ < 0.0) << 4 | 0x40;
      local_1478 = uVar62 ^ 0x10;
      local_1480 = uVar65 ^ 0x10;
      local_1488 = uVar66 ^ 0x10;
      local_13e0 = vshufps_avx(auVar77,auVar77,0);
      auVar136 = ZEXT1664(local_13e0);
      auVar72 = vshufps_avx(auVar81,auVar81,0);
      auVar76 = ZEXT1664(auVar72);
      local_1140._16_16_ = mm_lookupmask_ps._240_16_;
      local_1140._0_16_ = mm_lookupmask_ps._0_16_;
      auVar94._8_4_ = 0x3f800000;
      auVar94._0_8_ = &DAT_3f8000003f800000;
      auVar94._12_4_ = 0x3f800000;
      auVar94._16_4_ = 0x3f800000;
      auVar94._20_4_ = 0x3f800000;
      auVar94._24_4_ = 0x3f800000;
      auVar94._28_4_ = 0x3f800000;
      auVar79._8_4_ = 0xbf800000;
      auVar79._0_8_ = 0xbf800000bf800000;
      auVar79._12_4_ = 0xbf800000;
      auVar79._16_4_ = 0xbf800000;
      auVar79._20_4_ = 0xbf800000;
      auVar79._24_4_ = 0xbf800000;
      auVar79._28_4_ = 0xbf800000;
      local_1160 = vblendvps_avx(auVar94,auVar79,local_1140);
      do {
        do {
          do {
            if (local_1498 == (undefined1 (*) [16])&local_fa0) {
              return;
            }
            pauVar57 = local_1498 + -1;
            local_1498 = local_1498 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar57 + 8));
          uVar70 = *(ulong *)*local_1498;
          do {
            if ((uVar70 & 8) == 0) {
              auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + uVar62),auVar145._0_16_);
              auVar77._0_4_ = auVar174._0_4_ * auVar72._0_4_;
              auVar77._4_4_ = auVar174._4_4_ * auVar72._4_4_;
              auVar77._8_4_ = auVar174._8_4_ * auVar72._8_4_;
              auVar77._12_4_ = auVar174._12_4_ * auVar72._12_4_;
              auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + uVar65),auVar149._0_16_);
              auVar81._0_4_ = auVar177._0_4_ * auVar72._0_4_;
              auVar81._4_4_ = auVar177._4_4_ * auVar72._4_4_;
              auVar81._8_4_ = auVar177._8_4_ * auVar72._8_4_;
              auVar81._12_4_ = auVar177._12_4_ * auVar72._12_4_;
              auVar72 = vmaxps_avx(auVar77,auVar81);
              auVar93 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + uVar66),auVar165._0_16_);
              auVar82._0_4_ = auVar187._0_4_ * auVar93._0_4_;
              auVar82._4_4_ = auVar187._4_4_ * auVar93._4_4_;
              auVar82._8_4_ = auVar187._8_4_ * auVar93._8_4_;
              auVar82._12_4_ = auVar187._12_4_ * auVar93._12_4_;
              auVar93 = vmaxps_avx(auVar82,auVar136._0_16_);
              auVar93 = vmaxps_avx(auVar72,auVar93);
              auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + local_1478),
                                   auVar145._0_16_);
              auVar83._0_4_ = auVar201._0_4_ * auVar72._0_4_;
              auVar83._4_4_ = auVar201._4_4_ * auVar72._4_4_;
              auVar83._8_4_ = auVar201._8_4_ * auVar72._8_4_;
              auVar83._12_4_ = auVar201._12_4_ * auVar72._12_4_;
              auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + local_1480),
                                   auVar149._0_16_);
              auVar90._0_4_ = auVar203._0_4_ * auVar72._0_4_;
              auVar90._4_4_ = auVar203._4_4_ * auVar72._4_4_;
              auVar90._8_4_ = auVar203._8_4_ * auVar72._8_4_;
              auVar90._12_4_ = auVar203._12_4_ * auVar72._12_4_;
              auVar72 = vminps_avx(auVar83,auVar90);
              auVar77 = vsubps_avx(*(undefined1 (*) [16])(uVar70 + 0x20 + local_1488),
                                   auVar165._0_16_);
              auVar91._0_4_ = auVar207._0_4_ * auVar77._0_4_;
              auVar91._4_4_ = auVar207._4_4_ * auVar77._4_4_;
              auVar91._8_4_ = auVar207._8_4_ * auVar77._8_4_;
              auVar91._12_4_ = auVar207._12_4_ * auVar77._12_4_;
              auVar77 = vminps_avx(auVar91,auVar76._0_16_);
              auVar72 = vminps_avx(auVar72,auVar77);
              auVar72 = vcmpps_avx(auVar93,auVar72,2);
              uVar67 = vmovmskps_avx(auVar72);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar67);
              local_1320._0_16_ = auVar93;
            }
            if ((uVar70 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar58 = 4;
              }
              else {
                uVar69 = uVar70 & 0xfffffffffffffff0;
                lVar64 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                  }
                }
                iVar58 = 0;
                uVar70 = *(ulong *)(uVar69 + lVar64 * 8);
                uVar63 = unaff_R12 - 1 & unaff_R12;
                if (uVar63 != 0) {
                  uVar60 = *(uint *)(local_1320 + lVar64 * 4);
                  lVar64 = 0;
                  if (uVar63 != 0) {
                    for (; (uVar63 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                    }
                  }
                  uVar3 = *(ulong *)(uVar69 + lVar64 * 8);
                  uVar59 = *(uint *)(local_1320 + lVar64 * 4);
                  uVar63 = uVar63 - 1 & uVar63;
                  if (uVar63 == 0) {
                    if (uVar60 < uVar59) {
                      *(ulong *)*local_1498 = uVar3;
                      *(uint *)(*local_1498 + 8) = uVar59;
                      local_1498 = local_1498 + 1;
                    }
                    else {
                      *(ulong *)*local_1498 = uVar70;
                      *(uint *)(*local_1498 + 8) = uVar60;
                      local_1498 = local_1498 + 1;
                      uVar70 = uVar3;
                    }
                  }
                  else {
                    auVar78._8_8_ = 0;
                    auVar78._0_8_ = uVar70;
                    auVar72 = vpunpcklqdq_avx(auVar78,ZEXT416(uVar60));
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = uVar3;
                    auVar93 = vpunpcklqdq_avx(auVar84,ZEXT416(uVar59));
                    lVar64 = 0;
                    if (uVar63 != 0) {
                      for (; (uVar63 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                      }
                    }
                    auVar92._8_8_ = 0;
                    auVar92._0_8_ = *(ulong *)(uVar69 + lVar64 * 8);
                    auVar81 = vpunpcklqdq_avx(auVar92,ZEXT416(*(uint *)(local_1320 + lVar64 * 4)));
                    auVar77 = vpcmpgtd_avx(auVar93,auVar72);
                    uVar63 = uVar63 - 1 & uVar63;
                    if (uVar63 == 0) {
                      auVar89 = vpshufd_avx(auVar77,0xaa);
                      auVar77 = vblendvps_avx(auVar93,auVar72,auVar89);
                      auVar72 = vblendvps_avx(auVar72,auVar93,auVar89);
                      auVar93 = vpcmpgtd_avx(auVar81,auVar77);
                      auVar89 = vpshufd_avx(auVar93,0xaa);
                      auVar93 = vblendvps_avx(auVar81,auVar77,auVar89);
                      auVar77 = vblendvps_avx(auVar77,auVar81,auVar89);
                      auVar81 = vpcmpgtd_avx(auVar77,auVar72);
                      auVar89 = vpshufd_avx(auVar81,0xaa);
                      auVar81 = vblendvps_avx(auVar77,auVar72,auVar89);
                      auVar72 = vblendvps_avx(auVar72,auVar77,auVar89);
                      *local_1498 = auVar72;
                      local_1498[1] = auVar81;
                      uVar70 = auVar93._0_8_;
                      local_1498 = local_1498 + 2;
                    }
                    else {
                      lVar64 = 0;
                      if (uVar63 != 0) {
                        for (; (uVar63 >> lVar64 & 1) == 0; lVar64 = lVar64 + 1) {
                        }
                      }
                      auVar124._8_8_ = 0;
                      auVar124._0_8_ = *(ulong *)(uVar69 + lVar64 * 8);
                      auVar109 = vpunpcklqdq_avx(auVar124,ZEXT416(*(uint *)(local_1320 + lVar64 * 4)
                                                                 ));
                      auVar89 = vpshufd_avx(auVar77,0xaa);
                      auVar77 = vblendvps_avx(auVar93,auVar72,auVar89);
                      auVar72 = vblendvps_avx(auVar72,auVar93,auVar89);
                      auVar93 = vpcmpgtd_avx(auVar109,auVar81);
                      auVar89 = vpshufd_avx(auVar93,0xaa);
                      auVar93 = vblendvps_avx(auVar109,auVar81,auVar89);
                      auVar81 = vblendvps_avx(auVar81,auVar109,auVar89);
                      auVar89 = vpcmpgtd_avx(auVar81,auVar72);
                      auVar109 = vpshufd_avx(auVar89,0xaa);
                      auVar89 = vblendvps_avx(auVar81,auVar72,auVar109);
                      auVar72 = vblendvps_avx(auVar72,auVar81,auVar109);
                      auVar81 = vpcmpgtd_avx(auVar93,auVar77);
                      auVar109 = vpshufd_avx(auVar81,0xaa);
                      auVar81 = vblendvps_avx(auVar93,auVar77,auVar109);
                      auVar93 = vblendvps_avx(auVar77,auVar93,auVar109);
                      auVar77 = vpcmpgtd_avx(auVar89,auVar93);
                      auVar109 = vpshufd_avx(auVar77,0xaa);
                      auVar77 = vblendvps_avx(auVar89,auVar93,auVar109);
                      auVar93 = vblendvps_avx(auVar93,auVar89,auVar109);
                      *local_1498 = auVar72;
                      local_1498[1] = auVar93;
                      local_1498[2] = auVar77;
                      auVar136 = ZEXT1664(local_13e0);
                      uVar70 = auVar81._0_8_;
                      local_1498 = local_1498 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar58 = 6;
            }
          } while (iVar58 == 0);
        } while (iVar58 != 6);
        local_1490 = (ulong)((uint)uVar70 & 0xf) - 8;
        if (local_1490 != 0) {
          uVar70 = uVar70 & 0xfffffffffffffff0;
          lVar64 = 0;
          local_1500 = unaff_R12;
          do {
            lVar61 = lVar64 * 0x60;
            pSVar68 = context->scene;
            ppfVar4 = (pSVar68->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar70 + 0x40 + lVar61)];
            pfVar6 = ppfVar4[*(uint *)(uVar70 + 0x44 + lVar61)];
            pfVar7 = ppfVar4[*(uint *)(uVar70 + 0x48 + lVar61)];
            pfVar8 = ppfVar4[*(uint *)(uVar70 + 0x4c + lVar61)];
            auVar77 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar70 + lVar61)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar70 + 8 + lVar61)))
            ;
            auVar72 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar70 + lVar61)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar70 + 8 + lVar61)))
            ;
            auVar81 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar70 + 4 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar70 + 0xc + lVar61)));
            auVar93 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar70 + 4 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar70 + 0xc + lVar61)));
            auVar109 = vunpcklps_avx(auVar72,auVar93);
            auVar122 = vunpcklps_avx(auVar77,auVar81);
            auVar72 = vunpckhps_avx(auVar77,auVar81);
            auVar81 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar70 + 0x10 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar70 + 0x18 + lVar61)));
            auVar93 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar70 + 0x10 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar70 + 0x18 + lVar61)));
            auVar89 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar70 + 0x14 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar70 + 0x1c + lVar61)));
            auVar77 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar70 + 0x14 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar70 + 0x1c + lVar61)));
            auVar123 = vunpcklps_avx(auVar93,auVar77);
            auVar82 = vunpcklps_avx(auVar81,auVar89);
            auVar93 = vunpckhps_avx(auVar81,auVar89);
            auVar89 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar70 + 0x20 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar70 + 0x28 + lVar61)));
            auVar77 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar70 + 0x20 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar70 + 0x28 + lVar61)));
            auVar83 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar70 + 0x24 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar70 + 0x2c + lVar61)));
            auVar81 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar70 + 0x24 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar70 + 0x2c + lVar61)));
            auVar90 = vunpcklps_avx(auVar77,auVar81);
            auVar91 = vunpcklps_avx(auVar89,auVar83);
            auVar77 = vunpckhps_avx(auVar89,auVar83);
            auVar83 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar70 + 0x30 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar70 + 0x38 + lVar61)));
            auVar81 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar70 + 0x30 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar70 + 0x38 + lVar61)));
            auVar78 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar70 + 0x34 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar70 + 0x3c + lVar61)));
            auVar89 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar70 + 0x34 + lVar61)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar70 + 0x3c + lVar61)));
            auVar89 = vunpcklps_avx(auVar81,auVar89);
            auVar84 = vunpcklps_avx(auVar83,auVar78);
            lVar1 = uVar70 + 0x40 + lVar61;
            local_fc0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
            auVar81 = vunpckhps_avx(auVar83,auVar78);
            uStack_fb0 = local_fc0;
            uStack_fa8 = uStack_fb8;
            lVar61 = uVar70 + 0x50 + lVar61;
            local_1340 = *(undefined8 *)(lVar61 + 0x10);
            uStack_1338 = *(undefined8 *)(lVar61 + 0x18);
            uStack_1330 = local_1340;
            uStack_1328 = uStack_1338;
            auVar125._16_16_ = auVar91;
            auVar125._0_16_ = auVar122;
            auVar143._16_16_ = auVar77;
            auVar143._0_16_ = auVar72;
            auVar206._16_16_ = auVar90;
            auVar206._0_16_ = auVar109;
            auVar110._16_16_ = auVar82;
            auVar110._0_16_ = auVar82;
            auVar202._16_16_ = auVar93;
            auVar202._0_16_ = auVar93;
            auVar85._16_16_ = auVar123;
            auVar85._0_16_ = auVar123;
            auVar163._16_16_ = auVar84;
            auVar163._0_16_ = auVar84;
            auVar148._16_16_ = auVar81;
            auVar148._0_16_ = auVar81;
            auVar173._16_16_ = auVar89;
            auVar173._0_16_ = auVar89;
            uVar67 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar176._4_4_ = uVar67;
            auVar176._0_4_ = uVar67;
            auVar176._8_4_ = uVar67;
            auVar176._12_4_ = uVar67;
            auVar176._16_4_ = uVar67;
            auVar176._20_4_ = uVar67;
            auVar176._24_4_ = uVar67;
            auVar176._28_4_ = uVar67;
            uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar186._4_4_ = uVar67;
            auVar186._0_4_ = uVar67;
            auVar186._8_4_ = uVar67;
            auVar186._12_4_ = uVar67;
            auVar186._16_4_ = uVar67;
            auVar186._20_4_ = uVar67;
            auVar186._24_4_ = uVar67;
            auVar186._28_4_ = uVar67;
            uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar200._4_4_ = uVar67;
            auVar200._0_4_ = uVar67;
            auVar200._8_4_ = uVar67;
            auVar200._12_4_ = uVar67;
            auVar200._16_4_ = uVar67;
            auVar200._20_4_ = uVar67;
            auVar200._24_4_ = uVar67;
            auVar200._28_4_ = uVar67;
            local_fe0 = vsubps_avx(auVar125,auVar176);
            local_1000 = vsubps_avx(auVar143,auVar186);
            local_1020 = vsubps_avx(auVar206,auVar200);
            auVar79 = vsubps_avx(auVar110,auVar176);
            auVar94 = vsubps_avx(auVar202,auVar186);
            auVar22 = vsubps_avx(auVar85,auVar200);
            auVar85 = vsubps_avx(auVar163,auVar176);
            auVar23 = vsubps_avx(auVar148,auVar186);
            auVar24 = vsubps_avx(auVar173,auVar200);
            local_1040 = vsubps_avx(auVar85,local_fe0);
            local_1060 = vsubps_avx(auVar23,local_1000);
            local_1080 = vsubps_avx(auVar24,local_1020);
            fVar12 = local_1000._0_4_;
            fVar108 = auVar23._0_4_ + fVar12;
            fVar14 = local_1000._4_4_;
            fVar114 = auVar23._4_4_ + fVar14;
            fVar16 = local_1000._8_4_;
            fVar115 = auVar23._8_4_ + fVar16;
            fVar18 = local_1000._12_4_;
            fVar116 = auVar23._12_4_ + fVar18;
            fVar103 = local_1000._16_4_;
            fVar117 = auVar23._16_4_ + fVar103;
            fVar107 = local_1000._20_4_;
            fVar118 = auVar23._20_4_ + fVar107;
            fVar20 = local_1000._24_4_;
            fVar119 = auVar23._24_4_ + fVar20;
            fVar71 = local_1000._28_4_;
            fVar204 = local_1020._0_4_;
            fVar120 = fVar204 + auVar24._0_4_;
            fVar208 = local_1020._4_4_;
            fVar127 = fVar208 + auVar24._4_4_;
            fVar210 = local_1020._8_4_;
            fVar129 = fVar210 + auVar24._8_4_;
            fVar212 = local_1020._12_4_;
            fVar130 = fVar212 + auVar24._12_4_;
            fVar214 = local_1020._16_4_;
            fVar131 = fVar214 + auVar24._16_4_;
            fVar216 = local_1020._20_4_;
            fVar132 = fVar216 + auVar24._20_4_;
            fVar218 = local_1020._24_4_;
            fVar133 = fVar218 + auVar24._24_4_;
            fVar87 = local_1020._28_4_;
            fVar134 = local_1080._0_4_;
            fVar137 = local_1080._4_4_;
            auVar25._4_4_ = fVar137 * fVar114;
            auVar25._0_4_ = fVar134 * fVar108;
            fVar138 = local_1080._8_4_;
            auVar25._8_4_ = fVar138 * fVar115;
            fVar139 = local_1080._12_4_;
            auVar25._12_4_ = fVar139 * fVar116;
            fVar140 = local_1080._16_4_;
            auVar25._16_4_ = fVar140 * fVar117;
            fVar141 = local_1080._20_4_;
            auVar25._20_4_ = fVar141 * fVar118;
            fVar142 = local_1080._24_4_;
            auVar25._24_4_ = fVar142 * fVar119;
            auVar25._28_4_ = auVar81._12_4_;
            fVar184 = local_1060._0_4_;
            fVar188 = local_1060._4_4_;
            auVar26._4_4_ = fVar188 * fVar127;
            auVar26._0_4_ = fVar184 * fVar120;
            fVar190 = local_1060._8_4_;
            auVar26._8_4_ = fVar190 * fVar129;
            fVar192 = local_1060._12_4_;
            auVar26._12_4_ = fVar192 * fVar130;
            fVar194 = local_1060._16_4_;
            auVar26._16_4_ = fVar194 * fVar131;
            fVar196 = local_1060._20_4_;
            auVar26._20_4_ = fVar196 * fVar132;
            fVar198 = local_1060._24_4_;
            auVar26._24_4_ = fVar198 * fVar133;
            auVar26._28_4_ = auVar84._12_4_;
            auVar25 = vsubps_avx(auVar26,auVar25);
            fVar13 = local_fe0._0_4_;
            fVar162 = auVar85._0_4_ + fVar13;
            fVar15 = local_fe0._4_4_;
            fVar166 = auVar85._4_4_ + fVar15;
            fVar17 = local_fe0._8_4_;
            fVar167 = auVar85._8_4_ + fVar17;
            fVar101 = local_fe0._12_4_;
            fVar168 = auVar85._12_4_ + fVar101;
            fVar105 = local_fe0._16_4_;
            fVar169 = auVar85._16_4_ + fVar105;
            fVar19 = local_fe0._20_4_;
            fVar170 = auVar85._20_4_ + fVar19;
            fVar21 = local_fe0._24_4_;
            fVar171 = auVar85._24_4_ + fVar21;
            fVar175 = local_1040._0_4_;
            fVar178 = local_1040._4_4_;
            auVar27._4_4_ = fVar178 * fVar127;
            auVar27._0_4_ = fVar175 * fVar120;
            fVar179 = local_1040._8_4_;
            auVar27._8_4_ = fVar179 * fVar129;
            fVar180 = local_1040._12_4_;
            auVar27._12_4_ = fVar180 * fVar130;
            fVar181 = local_1040._16_4_;
            auVar27._16_4_ = fVar181 * fVar131;
            fVar182 = local_1040._20_4_;
            auVar27._20_4_ = fVar182 * fVar132;
            fVar183 = local_1040._24_4_;
            auVar27._24_4_ = fVar183 * fVar133;
            auVar27._28_4_ = fVar87 + auVar24._28_4_;
            auVar110 = local_1080;
            auVar28._4_4_ = fVar166 * fVar137;
            auVar28._0_4_ = fVar162 * fVar134;
            auVar28._8_4_ = fVar167 * fVar138;
            auVar28._12_4_ = fVar168 * fVar139;
            auVar28._16_4_ = fVar169 * fVar140;
            auVar28._20_4_ = fVar170 * fVar141;
            auVar28._24_4_ = fVar171 * fVar142;
            auVar28._28_4_ = auVar89._12_4_;
            auVar26 = vsubps_avx(auVar28,auVar27);
            auVar29._4_4_ = fVar188 * fVar166;
            auVar29._0_4_ = fVar184 * fVar162;
            auVar29._8_4_ = fVar190 * fVar167;
            auVar29._12_4_ = fVar192 * fVar168;
            auVar29._16_4_ = fVar194 * fVar169;
            auVar29._20_4_ = fVar196 * fVar170;
            auVar29._24_4_ = fVar198 * fVar171;
            auVar29._28_4_ = auVar85._28_4_ + local_fe0._28_4_;
            auVar28 = local_1040;
            auVar30._4_4_ = fVar178 * fVar114;
            auVar30._0_4_ = fVar175 * fVar108;
            auVar30._8_4_ = fVar179 * fVar115;
            auVar30._12_4_ = fVar180 * fVar116;
            auVar30._16_4_ = fVar181 * fVar117;
            auVar30._20_4_ = fVar182 * fVar118;
            auVar30._24_4_ = fVar183 * fVar119;
            auVar30._28_4_ = auVar23._28_4_ + fVar71;
            auVar27 = vsubps_avx(auVar30,auVar29);
            local_14c0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_141c = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_1440._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_10e0._0_4_ =
                 local_1440._4_4_ * auVar25._0_4_ +
                 (float)local_14c0._4_4_ * auVar26._0_4_ + fStack_141c * auVar27._0_4_;
            local_10e0._4_4_ =
                 local_1440._4_4_ * auVar25._4_4_ +
                 (float)local_14c0._4_4_ * auVar26._4_4_ + fStack_141c * auVar27._4_4_;
            local_10e0._8_4_ =
                 local_1440._4_4_ * auVar25._8_4_ +
                 (float)local_14c0._4_4_ * auVar26._8_4_ + fStack_141c * auVar27._8_4_;
            local_10e0._12_4_ =
                 local_1440._4_4_ * auVar25._12_4_ +
                 (float)local_14c0._4_4_ * auVar26._12_4_ + fStack_141c * auVar27._12_4_;
            local_10e0._16_4_ =
                 local_1440._4_4_ * auVar25._16_4_ +
                 (float)local_14c0._4_4_ * auVar26._16_4_ + fStack_141c * auVar27._16_4_;
            local_10e0._20_4_ =
                 local_1440._4_4_ * auVar25._20_4_ +
                 (float)local_14c0._4_4_ * auVar26._20_4_ + fStack_141c * auVar27._20_4_;
            local_10e0._24_4_ =
                 local_1440._4_4_ * auVar25._24_4_ +
                 (float)local_14c0._4_4_ * auVar26._24_4_ + fStack_141c * auVar27._24_4_;
            local_10e0._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar27._28_4_;
            local_10a0 = vsubps_avx(local_1000,auVar94);
            local_10c0 = vsubps_avx(local_1020,auVar22);
            fVar114 = fVar12 + auVar94._0_4_;
            fVar115 = fVar14 + auVar94._4_4_;
            fVar116 = fVar16 + auVar94._8_4_;
            fVar117 = fVar18 + auVar94._12_4_;
            fVar118 = fVar103 + auVar94._16_4_;
            fVar119 = fVar107 + auVar94._20_4_;
            fVar120 = fVar20 + auVar94._24_4_;
            fVar108 = auVar94._28_4_;
            fVar127 = fVar204 + auVar22._0_4_;
            fVar129 = fVar208 + auVar22._4_4_;
            fVar130 = fVar210 + auVar22._8_4_;
            fVar131 = fVar212 + auVar22._12_4_;
            fVar132 = fVar214 + auVar22._16_4_;
            fVar133 = fVar216 + auVar22._20_4_;
            fVar162 = fVar218 + auVar22._24_4_;
            fVar185 = local_10c0._0_4_;
            fVar189 = local_10c0._4_4_;
            auVar31._4_4_ = fVar189 * fVar115;
            auVar31._0_4_ = fVar185 * fVar114;
            fVar191 = local_10c0._8_4_;
            auVar31._8_4_ = fVar191 * fVar116;
            fVar193 = local_10c0._12_4_;
            auVar31._12_4_ = fVar193 * fVar117;
            fVar195 = local_10c0._16_4_;
            auVar31._16_4_ = fVar195 * fVar118;
            fVar197 = local_10c0._20_4_;
            auVar31._20_4_ = fVar197 * fVar119;
            fVar199 = local_10c0._24_4_;
            auVar31._24_4_ = fVar199 * fVar120;
            auVar31._28_4_ = fVar87;
            fVar146 = local_10a0._0_4_;
            fVar150 = local_10a0._4_4_;
            auVar32._4_4_ = fVar150 * fVar129;
            auVar32._0_4_ = fVar146 * fVar127;
            fVar152 = local_10a0._8_4_;
            auVar32._8_4_ = fVar152 * fVar130;
            fVar154 = local_10a0._12_4_;
            auVar32._12_4_ = fVar154 * fVar131;
            fVar156 = local_10a0._16_4_;
            auVar32._16_4_ = fVar156 * fVar132;
            fVar158 = local_10a0._20_4_;
            auVar32._20_4_ = fVar158 * fVar133;
            fVar160 = local_10a0._24_4_;
            auVar32._24_4_ = fVar160 * fVar162;
            auVar32._28_4_ = fVar71;
            auVar25 = vsubps_avx(auVar32,auVar31);
            auVar26 = vsubps_avx(local_fe0,auVar79);
            fVar205 = auVar26._0_4_;
            fVar209 = auVar26._4_4_;
            auVar33._4_4_ = fVar209 * fVar129;
            auVar33._0_4_ = fVar205 * fVar127;
            fVar211 = auVar26._8_4_;
            auVar33._8_4_ = fVar211 * fVar130;
            fVar213 = auVar26._12_4_;
            auVar33._12_4_ = fVar213 * fVar131;
            fVar215 = auVar26._16_4_;
            auVar33._16_4_ = fVar215 * fVar132;
            fVar217 = auVar26._20_4_;
            auVar33._20_4_ = fVar217 * fVar133;
            fVar219 = auVar26._24_4_;
            auVar33._24_4_ = fVar219 * fVar162;
            auVar33._28_4_ = fVar87 + auVar22._28_4_;
            fVar127 = fVar13 + auVar79._0_4_;
            fVar129 = fVar15 + auVar79._4_4_;
            fVar130 = fVar17 + auVar79._8_4_;
            fVar131 = fVar101 + auVar79._12_4_;
            fVar132 = fVar105 + auVar79._16_4_;
            fVar133 = fVar19 + auVar79._20_4_;
            fVar162 = fVar21 + auVar79._24_4_;
            fVar172 = local_fe0._28_4_ + auVar79._28_4_;
            auVar34._4_4_ = fVar189 * fVar129;
            auVar34._0_4_ = fVar185 * fVar127;
            auVar34._8_4_ = fVar191 * fVar130;
            auVar34._12_4_ = fVar193 * fVar131;
            auVar34._16_4_ = fVar195 * fVar132;
            auVar34._20_4_ = fVar197 * fVar133;
            auVar34._24_4_ = fVar199 * fVar162;
            auVar34._28_4_ = local_10c0._28_4_;
            auVar26 = vsubps_avx(auVar34,auVar33);
            auVar35._4_4_ = fVar150 * fVar129;
            auVar35._0_4_ = fVar146 * fVar127;
            auVar35._8_4_ = fVar152 * fVar130;
            auVar35._12_4_ = fVar154 * fVar131;
            auVar35._16_4_ = fVar156 * fVar132;
            auVar35._20_4_ = fVar158 * fVar133;
            auVar35._24_4_ = fVar160 * fVar162;
            auVar35._28_4_ = fVar172;
            auVar36._4_4_ = fVar209 * fVar115;
            auVar36._0_4_ = fVar205 * fVar114;
            auVar36._8_4_ = fVar211 * fVar116;
            auVar36._12_4_ = fVar213 * fVar117;
            auVar36._16_4_ = fVar215 * fVar118;
            auVar36._20_4_ = fVar217 * fVar119;
            auVar36._24_4_ = fVar219 * fVar120;
            auVar36._28_4_ = fVar71 + fVar108;
            auVar27 = vsubps_avx(auVar36,auVar35);
            local_1300._0_4_ =
                 local_1440._4_4_ * auVar25._0_4_ +
                 (float)local_14c0._4_4_ * auVar26._0_4_ + fStack_141c * auVar27._0_4_;
            local_1300._4_4_ =
                 local_1440._4_4_ * auVar25._4_4_ +
                 (float)local_14c0._4_4_ * auVar26._4_4_ + fStack_141c * auVar27._4_4_;
            local_1300._8_4_ =
                 local_1440._4_4_ * auVar25._8_4_ +
                 (float)local_14c0._4_4_ * auVar26._8_4_ + fStack_141c * auVar27._8_4_;
            local_1300._12_4_ =
                 local_1440._4_4_ * auVar25._12_4_ +
                 (float)local_14c0._4_4_ * auVar26._12_4_ + fStack_141c * auVar27._12_4_;
            local_1300._16_4_ =
                 local_1440._4_4_ * auVar25._16_4_ +
                 (float)local_14c0._4_4_ * auVar26._16_4_ + fStack_141c * auVar27._16_4_;
            local_1300._20_4_ =
                 local_1440._4_4_ * auVar25._20_4_ +
                 (float)local_14c0._4_4_ * auVar26._20_4_ + fStack_141c * auVar27._20_4_;
            local_1300._24_4_ =
                 local_1440._4_4_ * auVar25._24_4_ +
                 (float)local_14c0._4_4_ * auVar26._24_4_ + fStack_141c * auVar27._24_4_;
            local_1300._28_4_ = auVar25._28_4_ + auVar26._28_4_ + auVar27._28_4_;
            auVar25 = vsubps_avx(auVar79,auVar85);
            fVar162 = auVar79._0_4_ + auVar85._0_4_;
            fVar166 = auVar79._4_4_ + auVar85._4_4_;
            fVar167 = auVar79._8_4_ + auVar85._8_4_;
            fVar168 = auVar79._12_4_ + auVar85._12_4_;
            fVar169 = auVar79._16_4_ + auVar85._16_4_;
            fVar170 = auVar79._20_4_ + auVar85._20_4_;
            fVar171 = auVar79._24_4_ + auVar85._24_4_;
            fVar87 = auVar79._28_4_ + auVar85._28_4_;
            auVar79 = vsubps_avx(auVar94,auVar23);
            fVar120 = auVar94._0_4_ + auVar23._0_4_;
            fVar127 = auVar94._4_4_ + auVar23._4_4_;
            fVar129 = auVar94._8_4_ + auVar23._8_4_;
            fVar130 = auVar94._12_4_ + auVar23._12_4_;
            fVar131 = auVar94._16_4_ + auVar23._16_4_;
            fVar132 = auVar94._20_4_ + auVar23._20_4_;
            fVar133 = auVar94._24_4_ + auVar23._24_4_;
            auVar85 = vsubps_avx(auVar22,auVar24);
            fVar88 = auVar22._0_4_ + auVar24._0_4_;
            fVar98 = auVar22._4_4_ + auVar24._4_4_;
            fVar99 = auVar22._8_4_ + auVar24._8_4_;
            fVar100 = auVar22._12_4_ + auVar24._12_4_;
            fVar102 = auVar22._16_4_ + auVar24._16_4_;
            fVar104 = auVar22._20_4_ + auVar24._20_4_;
            fVar106 = auVar22._24_4_ + auVar24._24_4_;
            fVar71 = auVar85._0_4_;
            fVar114 = auVar85._4_4_;
            auVar37._4_4_ = fVar114 * fVar127;
            auVar37._0_4_ = fVar71 * fVar120;
            fVar115 = auVar85._8_4_;
            auVar37._8_4_ = fVar115 * fVar129;
            fVar116 = auVar85._12_4_;
            auVar37._12_4_ = fVar116 * fVar130;
            fVar117 = auVar85._16_4_;
            auVar37._16_4_ = fVar117 * fVar131;
            fVar118 = auVar85._20_4_;
            auVar37._20_4_ = fVar118 * fVar132;
            fVar119 = auVar85._24_4_;
            auVar37._24_4_ = fVar119 * fVar133;
            auVar37._28_4_ = fVar108;
            fVar147 = auVar79._0_4_;
            fVar151 = auVar79._4_4_;
            auVar38._4_4_ = fVar151 * fVar98;
            auVar38._0_4_ = fVar147 * fVar88;
            fVar153 = auVar79._8_4_;
            auVar38._8_4_ = fVar153 * fVar99;
            fVar155 = auVar79._12_4_;
            auVar38._12_4_ = fVar155 * fVar100;
            fVar157 = auVar79._16_4_;
            auVar38._16_4_ = fVar157 * fVar102;
            fVar159 = auVar79._20_4_;
            auVar38._20_4_ = fVar159 * fVar104;
            fVar161 = auVar79._24_4_;
            auVar38._24_4_ = fVar161 * fVar106;
            auVar38._28_4_ = fVar172;
            auVar79 = vsubps_avx(auVar38,auVar37);
            fVar121 = auVar25._0_4_;
            fVar128 = auVar25._4_4_;
            auVar39._4_4_ = fVar128 * fVar98;
            auVar39._0_4_ = fVar121 * fVar88;
            fVar88 = auVar25._8_4_;
            auVar39._8_4_ = fVar88 * fVar99;
            fVar98 = auVar25._12_4_;
            auVar39._12_4_ = fVar98 * fVar100;
            fVar99 = auVar25._16_4_;
            auVar39._16_4_ = fVar99 * fVar102;
            fVar100 = auVar25._20_4_;
            auVar39._20_4_ = fVar100 * fVar104;
            fVar102 = auVar25._24_4_;
            auVar39._24_4_ = fVar102 * fVar106;
            auVar39._28_4_ = auVar22._28_4_ + auVar24._28_4_;
            auVar22._4_4_ = fVar114 * fVar166;
            auVar22._0_4_ = fVar71 * fVar162;
            auVar22._8_4_ = fVar115 * fVar167;
            auVar22._12_4_ = fVar116 * fVar168;
            auVar22._16_4_ = fVar117 * fVar169;
            auVar22._20_4_ = fVar118 * fVar170;
            auVar22._24_4_ = fVar119 * fVar171;
            auVar22._28_4_ = fVar172;
            auVar94 = vsubps_avx(auVar22,auVar39);
            auVar24._4_4_ = fVar151 * fVar166;
            auVar24._0_4_ = fVar147 * fVar162;
            auVar24._8_4_ = fVar153 * fVar167;
            auVar24._12_4_ = fVar155 * fVar168;
            auVar24._16_4_ = fVar157 * fVar169;
            auVar24._20_4_ = fVar159 * fVar170;
            auVar24._24_4_ = fVar161 * fVar171;
            auVar24._28_4_ = fVar87;
            auVar40._4_4_ = fVar128 * fVar127;
            auVar40._0_4_ = fVar121 * fVar120;
            auVar40._8_4_ = fVar88 * fVar129;
            auVar40._12_4_ = fVar98 * fVar130;
            auVar40._16_4_ = fVar99 * fVar131;
            auVar40._20_4_ = fVar100 * fVar132;
            auVar40._24_4_ = fVar102 * fVar133;
            auVar40._28_4_ = fVar108 + auVar23._28_4_;
            auVar22 = vsubps_avx(auVar40,auVar24);
            local_1420 = fStack_141c;
            fStack_1418 = fStack_141c;
            fStack_1414 = fStack_141c;
            fStack_1410 = fStack_141c;
            fStack_140c = fStack_141c;
            fStack_1408 = fStack_141c;
            fStack_1404 = fStack_141c;
            local_14c0._0_4_ = local_14c0._4_4_;
            fStack_14b8 = (float)local_14c0._4_4_;
            fStack_14b4 = (float)local_14c0._4_4_;
            fStack_14b0 = (float)local_14c0._4_4_;
            fStack_14ac = (float)local_14c0._4_4_;
            fStack_14a8 = (float)local_14c0._4_4_;
            fStack_14a4 = (float)local_14c0._4_4_;
            local_1440._0_4_ = local_1440._4_4_;
            fStack_1438 = local_1440._4_4_;
            fStack_1434 = local_1440._4_4_;
            fStack_1430 = local_1440._4_4_;
            fStack_142c = local_1440._4_4_;
            fStack_1428 = local_1440._4_4_;
            fStack_1424 = local_1440._4_4_;
            auVar80._0_4_ =
                 local_1440._4_4_ * auVar79._0_4_ +
                 (float)local_14c0._4_4_ * auVar94._0_4_ + fStack_141c * auVar22._0_4_;
            auVar80._4_4_ =
                 local_1440._4_4_ * auVar79._4_4_ +
                 (float)local_14c0._4_4_ * auVar94._4_4_ + fStack_141c * auVar22._4_4_;
            auVar80._8_4_ =
                 local_1440._4_4_ * auVar79._8_4_ +
                 (float)local_14c0._4_4_ * auVar94._8_4_ + fStack_141c * auVar22._8_4_;
            auVar80._12_4_ =
                 local_1440._4_4_ * auVar79._12_4_ +
                 (float)local_14c0._4_4_ * auVar94._12_4_ + fStack_141c * auVar22._12_4_;
            auVar80._16_4_ =
                 local_1440._4_4_ * auVar79._16_4_ +
                 (float)local_14c0._4_4_ * auVar94._16_4_ + fStack_141c * auVar22._16_4_;
            auVar80._20_4_ =
                 local_1440._4_4_ * auVar79._20_4_ +
                 (float)local_14c0._4_4_ * auVar94._20_4_ + fStack_141c * auVar22._20_4_;
            auVar80._24_4_ =
                 local_1440._4_4_ * auVar79._24_4_ +
                 (float)local_14c0._4_4_ * auVar94._24_4_ + fStack_141c * auVar22._24_4_;
            auVar80._28_4_ = fVar87 + fVar87 + auVar22._28_4_;
            local_1120._0_4_ = auVar80._0_4_ + local_10e0._0_4_ + local_1300._0_4_;
            local_1120._4_4_ = auVar80._4_4_ + local_10e0._4_4_ + local_1300._4_4_;
            local_1120._8_4_ = auVar80._8_4_ + local_10e0._8_4_ + local_1300._8_4_;
            local_1120._12_4_ = auVar80._12_4_ + local_10e0._12_4_ + local_1300._12_4_;
            local_1120._16_4_ = auVar80._16_4_ + local_10e0._16_4_ + local_1300._16_4_;
            local_1120._20_4_ = auVar80._20_4_ + local_10e0._20_4_ + local_1300._20_4_;
            local_1120._24_4_ = auVar80._24_4_ + local_10e0._24_4_ + local_1300._24_4_;
            local_1120._28_4_ = auVar80._28_4_ + local_10e0._28_4_ + local_1300._28_4_;
            auVar79 = vminps_avx(local_10e0,local_1300);
            auVar79 = vminps_avx(auVar79,auVar80);
            auVar95._8_4_ = 0x7fffffff;
            auVar95._0_8_ = 0x7fffffff7fffffff;
            auVar95._12_4_ = 0x7fffffff;
            auVar95._16_4_ = 0x7fffffff;
            auVar95._20_4_ = 0x7fffffff;
            auVar95._24_4_ = 0x7fffffff;
            auVar95._28_4_ = 0x7fffffff;
            local_1100 = vandps_avx(local_1120,auVar95);
            fVar108 = local_1100._0_4_ * 1.1920929e-07;
            fVar120 = local_1100._4_4_ * 1.1920929e-07;
            auVar23._4_4_ = fVar120;
            auVar23._0_4_ = fVar108;
            fVar127 = local_1100._8_4_ * 1.1920929e-07;
            auVar23._8_4_ = fVar127;
            fVar129 = local_1100._12_4_ * 1.1920929e-07;
            auVar23._12_4_ = fVar129;
            fVar130 = local_1100._16_4_ * 1.1920929e-07;
            auVar23._16_4_ = fVar130;
            fVar131 = local_1100._20_4_ * 1.1920929e-07;
            auVar23._20_4_ = fVar131;
            fVar132 = local_1100._24_4_ * 1.1920929e-07;
            auVar23._24_4_ = fVar132;
            auVar23._28_4_ = 0x34000000;
            auVar164._0_8_ = CONCAT44(fVar120,fVar108) ^ 0x8000000080000000;
            auVar164._8_4_ = -fVar127;
            auVar164._12_4_ = -fVar129;
            auVar164._16_4_ = -fVar130;
            auVar164._20_4_ = -fVar131;
            auVar164._24_4_ = -fVar132;
            auVar164._28_4_ = 0xb4000000;
            auVar79 = vcmpps_avx(auVar79,auVar164,5);
            auVar22 = vmaxps_avx(local_10e0,local_1300);
            auVar94 = vmaxps_avx(auVar22,auVar80);
            auVar94 = vcmpps_avx(auVar94,auVar23,2);
            auVar94 = vorps_avx(auVar79,auVar94);
            if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar94 >> 0x7f,0) != '\0') ||
                  (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar94 >> 0xbf,0) != '\0') ||
                (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar94[0x1f] < '\0') {
              auVar41._4_4_ = fVar150 * fVar137;
              auVar41._0_4_ = fVar146 * fVar134;
              auVar41._8_4_ = fVar152 * fVar138;
              auVar41._12_4_ = fVar154 * fVar139;
              auVar41._16_4_ = fVar156 * fVar140;
              auVar41._20_4_ = fVar158 * fVar141;
              auVar41._24_4_ = fVar160 * fVar142;
              auVar41._28_4_ = auVar79._28_4_;
              auVar42._4_4_ = fVar189 * fVar188;
              auVar42._0_4_ = fVar185 * fVar184;
              auVar42._8_4_ = fVar191 * fVar190;
              auVar42._12_4_ = fVar193 * fVar192;
              auVar42._16_4_ = fVar195 * fVar194;
              auVar42._20_4_ = fVar197 * fVar196;
              auVar42._24_4_ = fVar199 * fVar198;
              auVar42._28_4_ = 0x34000000;
              auVar23 = vsubps_avx(auVar42,auVar41);
              auVar43._4_4_ = fVar189 * fVar151;
              auVar43._0_4_ = fVar185 * fVar147;
              auVar43._8_4_ = fVar191 * fVar153;
              auVar43._12_4_ = fVar193 * fVar155;
              auVar43._16_4_ = fVar195 * fVar157;
              auVar43._20_4_ = fVar197 * fVar159;
              auVar43._24_4_ = fVar199 * fVar161;
              auVar43._28_4_ = auVar22._28_4_;
              auVar44._4_4_ = fVar150 * fVar114;
              auVar44._0_4_ = fVar146 * fVar71;
              auVar44._8_4_ = fVar152 * fVar115;
              auVar44._12_4_ = fVar154 * fVar116;
              auVar44._16_4_ = fVar156 * fVar117;
              auVar44._20_4_ = fVar158 * fVar118;
              auVar44._24_4_ = fVar160 * fVar119;
              auVar44._28_4_ = local_1300._28_4_;
              auVar24 = vsubps_avx(auVar44,auVar43);
              auVar111._8_4_ = 0x7fffffff;
              auVar111._0_8_ = 0x7fffffff7fffffff;
              auVar111._12_4_ = 0x7fffffff;
              auVar111._16_4_ = 0x7fffffff;
              auVar111._20_4_ = 0x7fffffff;
              auVar111._24_4_ = 0x7fffffff;
              auVar111._28_4_ = 0x7fffffff;
              auVar79 = vandps_avx(auVar41,auVar111);
              auVar22 = vandps_avx(auVar43,auVar111);
              auVar79 = vcmpps_avx(auVar79,auVar22,1);
              local_12c0 = vblendvps_avx(auVar24,auVar23,auVar79);
              auVar45._4_4_ = fVar209 * fVar114;
              auVar45._0_4_ = fVar205 * fVar71;
              auVar45._8_4_ = fVar211 * fVar115;
              auVar45._12_4_ = fVar213 * fVar116;
              auVar45._16_4_ = fVar215 * fVar117;
              auVar45._20_4_ = fVar217 * fVar118;
              auVar45._24_4_ = fVar219 * fVar119;
              auVar45._28_4_ = auVar79._28_4_;
              auVar46._4_4_ = fVar209 * fVar137;
              auVar46._0_4_ = fVar205 * fVar134;
              auVar46._8_4_ = fVar211 * fVar138;
              auVar46._12_4_ = fVar213 * fVar139;
              auVar46._16_4_ = fVar215 * fVar140;
              auVar46._20_4_ = fVar217 * fVar141;
              auVar46._24_4_ = fVar219 * fVar142;
              auVar46._28_4_ = auVar23._28_4_;
              auVar47._4_4_ = fVar178 * fVar189;
              auVar47._0_4_ = fVar175 * fVar185;
              auVar47._8_4_ = fVar179 * fVar191;
              auVar47._12_4_ = fVar180 * fVar193;
              auVar47._16_4_ = fVar181 * fVar195;
              auVar47._20_4_ = fVar182 * fVar197;
              auVar47._24_4_ = fVar183 * fVar199;
              auVar47._28_4_ = local_1080._28_4_;
              auVar23 = vsubps_avx(auVar46,auVar47);
              auVar48._4_4_ = fVar189 * fVar128;
              auVar48._0_4_ = fVar185 * fVar121;
              auVar48._8_4_ = fVar191 * fVar88;
              auVar48._12_4_ = fVar193 * fVar98;
              auVar48._16_4_ = fVar195 * fVar99;
              auVar48._20_4_ = fVar197 * fVar100;
              auVar48._24_4_ = fVar199 * fVar102;
              auVar48._28_4_ = local_10c0._28_4_;
              auVar24 = vsubps_avx(auVar48,auVar45);
              auVar79 = vandps_avx(auVar47,auVar111);
              auVar22 = vandps_avx(auVar45,auVar111);
              auVar79 = vcmpps_avx(auVar79,auVar22,1);
              local_12a0 = vblendvps_avx(auVar24,auVar23,auVar79);
              auVar49._4_4_ = fVar150 * fVar128;
              auVar49._0_4_ = fVar146 * fVar121;
              auVar49._8_4_ = fVar152 * fVar88;
              auVar49._12_4_ = fVar154 * fVar98;
              auVar49._16_4_ = fVar156 * fVar99;
              auVar49._20_4_ = fVar158 * fVar100;
              auVar49._24_4_ = fVar160 * fVar102;
              auVar49._28_4_ = auVar79._28_4_;
              auVar50._4_4_ = fVar178 * fVar150;
              auVar50._0_4_ = fVar175 * fVar146;
              auVar50._8_4_ = fVar179 * fVar152;
              auVar50._12_4_ = fVar180 * fVar154;
              auVar50._16_4_ = fVar181 * fVar156;
              auVar50._20_4_ = fVar182 * fVar158;
              auVar50._24_4_ = fVar183 * fVar160;
              auVar50._28_4_ = auVar23._28_4_;
              auVar51._4_4_ = fVar209 * fVar188;
              auVar51._0_4_ = fVar205 * fVar184;
              auVar51._8_4_ = fVar211 * fVar190;
              auVar51._12_4_ = fVar213 * fVar192;
              auVar51._16_4_ = fVar215 * fVar194;
              auVar51._20_4_ = fVar217 * fVar196;
              auVar51._24_4_ = fVar219 * fVar198;
              auVar51._28_4_ = auVar25._28_4_;
              auVar52._4_4_ = fVar209 * fVar151;
              auVar52._0_4_ = fVar205 * fVar147;
              auVar52._8_4_ = fVar211 * fVar153;
              auVar52._12_4_ = fVar213 * fVar155;
              auVar52._16_4_ = fVar215 * fVar157;
              auVar52._20_4_ = fVar217 * fVar159;
              auVar52._24_4_ = fVar219 * fVar161;
              auVar52._28_4_ = auVar85._28_4_;
              auVar85 = vsubps_avx(auVar50,auVar51);
              auVar23 = vsubps_avx(auVar52,auVar49);
              auVar79 = vandps_avx(auVar51,auVar111);
              auVar22 = vandps_avx(auVar49,auVar111);
              auVar22 = vcmpps_avx(auVar79,auVar22,1);
              local_1280 = vblendvps_avx(auVar23,auVar85,auVar22);
              auVar72 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
              fVar71 = local_1280._0_4_;
              fVar108 = local_1280._4_4_;
              fVar114 = local_1280._8_4_;
              fVar115 = local_1280._12_4_;
              fVar116 = local_1280._16_4_;
              fVar117 = local_1280._20_4_;
              fVar118 = local_1280._24_4_;
              fVar162 = local_12a0._0_4_;
              fVar166 = local_12a0._4_4_;
              fVar167 = local_12a0._8_4_;
              fVar168 = local_12a0._12_4_;
              fVar169 = local_12a0._16_4_;
              fVar170 = local_12a0._20_4_;
              fVar171 = local_12a0._24_4_;
              fVar87 = local_12c0._0_4_;
              fVar88 = local_12c0._4_4_;
              fVar98 = local_12c0._8_4_;
              fVar99 = local_12c0._12_4_;
              fVar100 = local_12c0._16_4_;
              fVar102 = local_12c0._20_4_;
              fVar104 = local_12c0._24_4_;
              fVar119 = fVar87 * local_1440._4_4_ +
                        fVar162 * (float)local_14c0._4_4_ + fVar71 * fStack_141c;
              fVar120 = fVar88 * local_1440._4_4_ +
                        fVar166 * (float)local_14c0._4_4_ + fVar108 * fStack_141c;
              fVar127 = fVar98 * local_1440._4_4_ +
                        fVar167 * (float)local_14c0._4_4_ + fVar114 * fStack_141c;
              fVar129 = fVar99 * local_1440._4_4_ +
                        fVar168 * (float)local_14c0._4_4_ + fVar115 * fStack_141c;
              fVar130 = fVar100 * local_1440._4_4_ +
                        fVar169 * (float)local_14c0._4_4_ + fVar116 * fStack_141c;
              fVar131 = fVar102 * local_1440._4_4_ +
                        fVar170 * (float)local_14c0._4_4_ + fVar117 * fStack_141c;
              fVar132 = fVar104 * local_1440._4_4_ +
                        fVar171 * (float)local_14c0._4_4_ + fVar118 * fStack_141c;
              fVar133 = auVar85._28_4_ + auVar85._28_4_ + 0.0;
              auVar86._0_4_ = fVar119 + fVar119;
              auVar86._4_4_ = fVar120 + fVar120;
              auVar86._8_4_ = fVar127 + fVar127;
              auVar86._12_4_ = fVar129 + fVar129;
              auVar86._16_4_ = fVar130 + fVar130;
              auVar86._20_4_ = fVar131 + fVar131;
              auVar86._24_4_ = fVar132 + fVar132;
              auVar86._28_4_ = fVar133 + fVar133;
              auVar94 = vrcpps_avx(auVar86);
              fVar119 = fVar87 * fVar13 + fVar162 * fVar12 + fVar71 * fVar204;
              fVar120 = fVar88 * fVar15 + fVar166 * fVar14 + fVar108 * fVar208;
              fVar127 = fVar98 * fVar17 + fVar167 * fVar16 + fVar114 * fVar210;
              fVar101 = fVar99 * fVar101 + fVar168 * fVar18 + fVar115 * fVar212;
              fVar103 = fVar100 * fVar105 + fVar169 * fVar103 + fVar116 * fVar214;
              fVar105 = fVar102 * fVar19 + fVar170 * fVar107 + fVar117 * fVar216;
              fVar107 = fVar104 * fVar21 + fVar171 * fVar20 + fVar118 * fVar218;
              fVar12 = auVar94._0_4_;
              fVar13 = auVar94._4_4_;
              auVar53._4_4_ = auVar86._4_4_ * fVar13;
              auVar53._0_4_ = auVar86._0_4_ * fVar12;
              fVar14 = auVar94._8_4_;
              auVar53._8_4_ = auVar86._8_4_ * fVar14;
              fVar15 = auVar94._12_4_;
              auVar53._12_4_ = auVar86._12_4_ * fVar15;
              fVar16 = auVar94._16_4_;
              auVar53._16_4_ = auVar86._16_4_ * fVar16;
              fVar17 = auVar94._20_4_;
              auVar53._20_4_ = auVar86._20_4_ * fVar17;
              fVar18 = auVar94._24_4_;
              auVar53._24_4_ = auVar86._24_4_ * fVar18;
              auVar53._28_4_ = auVar79._28_4_;
              auVar112._8_4_ = 0x3f800000;
              auVar112._0_8_ = &DAT_3f8000003f800000;
              auVar112._12_4_ = 0x3f800000;
              auVar112._16_4_ = 0x3f800000;
              auVar112._20_4_ = 0x3f800000;
              auVar112._24_4_ = 0x3f800000;
              auVar112._28_4_ = 0x3f800000;
              auVar79 = vsubps_avx(auVar112,auVar53);
              uVar67 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar135._4_4_ = uVar67;
              auVar135._0_4_ = uVar67;
              auVar135._8_4_ = uVar67;
              auVar135._12_4_ = uVar67;
              auVar135._16_4_ = uVar67;
              auVar135._20_4_ = uVar67;
              auVar135._24_4_ = uVar67;
              auVar135._28_4_ = uVar67;
              local_14c0._4_4_ = (fVar120 + fVar120) * (fVar13 + fVar13 * auVar79._4_4_);
              local_14c0._0_4_ = (fVar119 + fVar119) * (fVar12 + fVar12 * auVar79._0_4_);
              fStack_14b8 = (fVar127 + fVar127) * (fVar14 + fVar14 * auVar79._8_4_);
              fStack_14b4 = (fVar101 + fVar101) * (fVar15 + fVar15 * auVar79._12_4_);
              fStack_14b0 = (fVar103 + fVar103) * (fVar16 + fVar16 * auVar79._16_4_);
              fStack_14ac = (fVar105 + fVar105) * (fVar17 + fVar17 * auVar79._20_4_);
              fStack_14a8 = (fVar107 + fVar107) * (fVar18 + fVar18 * auVar79._24_4_);
              fStack_14a4 = (float)local_1040._28_4_;
              auVar79 = vcmpps_avx(auVar135,_local_14c0,2);
              fVar12 = (ray->super_RayK<1>).tfar;
              auVar126._4_4_ = fVar12;
              auVar126._0_4_ = fVar12;
              auVar126._8_4_ = fVar12;
              auVar126._12_4_ = fVar12;
              auVar126._16_4_ = fVar12;
              auVar126._20_4_ = fVar12;
              auVar126._24_4_ = fVar12;
              auVar126._28_4_ = fVar12;
              auVar94 = vcmpps_avx(_local_14c0,auVar126,2);
              auVar79 = vandps_avx(auVar94,auVar79);
              auVar22 = vcmpps_avx(auVar86,_DAT_02020f00,4);
              auVar79 = vandps_avx(auVar79,auVar22);
              auVar93 = vpackssdw_avx(auVar79._0_16_,auVar79._16_16_);
              auVar72 = vpand_avx(auVar93,auVar72);
              auVar93 = vpmovsxwd_avx(auVar72);
              auVar77 = vpshufd_avx(auVar72,0xee);
              auVar77 = vpmovsxwd_avx(auVar77);
              local_1260._16_16_ = auVar77;
              local_1260._0_16_ = auVar93;
              if ((((((((local_1260 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1260 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1260 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1260 >> 0x7f,0) != '\0') ||
                    (local_1260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar77 >> 0x3f,0) != '\0') ||
                  (local_1260 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar77[0xf] < '\0') {
                local_1320 = local_10e0;
                local_12e0 = local_1120;
                local_1200 = _local_14c0;
                local_1180 = local_1140;
                local_1400 = local_1260;
                auVar79 = vrcpps_avx(local_1120);
                fVar12 = auVar79._0_4_;
                fVar13 = auVar79._4_4_;
                auVar54._4_4_ = local_1120._4_4_ * fVar13;
                auVar54._0_4_ = local_1120._0_4_ * fVar12;
                fVar14 = auVar79._8_4_;
                auVar54._8_4_ = local_1120._8_4_ * fVar14;
                fVar15 = auVar79._12_4_;
                auVar54._12_4_ = local_1120._12_4_ * fVar15;
                fVar16 = auVar79._16_4_;
                auVar54._16_4_ = local_1120._16_4_ * fVar16;
                fVar17 = auVar79._20_4_;
                auVar54._20_4_ = local_1120._20_4_ * fVar17;
                fVar18 = auVar79._24_4_;
                auVar54._24_4_ = local_1120._24_4_ * fVar18;
                auVar54._28_4_ = auVar94._28_4_;
                auVar144._8_4_ = 0x3f800000;
                auVar144._0_8_ = &DAT_3f8000003f800000;
                auVar144._12_4_ = 0x3f800000;
                auVar144._16_4_ = 0x3f800000;
                auVar144._20_4_ = 0x3f800000;
                auVar144._24_4_ = 0x3f800000;
                auVar144._28_4_ = 0x3f800000;
                auVar94 = vsubps_avx(auVar144,auVar54);
                auVar96._0_4_ = fVar12 + fVar12 * auVar94._0_4_;
                auVar96._4_4_ = fVar13 + fVar13 * auVar94._4_4_;
                auVar96._8_4_ = fVar14 + fVar14 * auVar94._8_4_;
                auVar96._12_4_ = fVar15 + fVar15 * auVar94._12_4_;
                auVar96._16_4_ = fVar16 + fVar16 * auVar94._16_4_;
                auVar96._20_4_ = fVar17 + fVar17 * auVar94._20_4_;
                auVar96._24_4_ = fVar18 + fVar18 * auVar94._24_4_;
                auVar96._28_4_ = auVar79._28_4_ + auVar94._28_4_;
                auVar113._8_4_ = 0x219392ef;
                auVar113._0_8_ = 0x219392ef219392ef;
                auVar113._12_4_ = 0x219392ef;
                auVar113._16_4_ = 0x219392ef;
                auVar113._20_4_ = 0x219392ef;
                auVar113._24_4_ = 0x219392ef;
                auVar113._28_4_ = 0x219392ef;
                auVar94 = vcmpps_avx(local_1100,auVar113,5);
                auVar79 = vandps_avx(auVar94,auVar96);
                auVar55._4_4_ = local_10e0._4_4_ * auVar79._4_4_;
                auVar55._0_4_ = local_10e0._0_4_ * auVar79._0_4_;
                auVar55._8_4_ = local_10e0._8_4_ * auVar79._8_4_;
                auVar55._12_4_ = local_10e0._12_4_ * auVar79._12_4_;
                auVar55._16_4_ = local_10e0._16_4_ * auVar79._16_4_;
                auVar55._20_4_ = local_10e0._20_4_ * auVar79._20_4_;
                auVar55._24_4_ = local_10e0._24_4_ * auVar79._24_4_;
                auVar55._28_4_ = auVar94._28_4_;
                auVar94 = vminps_avx(auVar55,auVar144);
                auVar56._4_4_ = local_1300._4_4_ * auVar79._4_4_;
                auVar56._0_4_ = local_1300._0_4_ * auVar79._0_4_;
                auVar56._8_4_ = local_1300._8_4_ * auVar79._8_4_;
                auVar56._12_4_ = local_1300._12_4_ * auVar79._12_4_;
                auVar56._16_4_ = local_1300._16_4_ * auVar79._16_4_;
                auVar56._20_4_ = local_1300._20_4_ * auVar79._20_4_;
                auVar56._24_4_ = local_1300._24_4_ * auVar79._24_4_;
                auVar56._28_4_ = auVar79._28_4_;
                auVar79 = vminps_avx(auVar56,auVar144);
                auVar22 = vsubps_avx(auVar144,auVar94);
                local_1220 = vblendvps_avx(auVar79,auVar22,local_1140);
                auVar79 = vsubps_avx(auVar144,auVar79);
                local_1240 = vblendvps_avx(auVar94,auVar79,local_1140);
                fVar12 = local_1160._0_4_;
                fVar13 = local_1160._4_4_;
                fVar14 = local_1160._8_4_;
                fVar15 = local_1160._12_4_;
                fVar16 = local_1160._16_4_;
                fVar17 = local_1160._20_4_;
                fVar18 = local_1160._24_4_;
                local_11e0[0] = fVar87 * fVar12;
                local_11e0[1] = fVar88 * fVar13;
                local_11e0[2] = fVar98 * fVar14;
                local_11e0[3] = fVar99 * fVar15;
                fStack_11d0 = fVar100 * fVar16;
                fStack_11cc = fVar102 * fVar17;
                fStack_11c8 = fVar104 * fVar18;
                uStack_11c4 = local_1240._28_4_;
                local_11c0[0] = fVar162 * fVar12;
                local_11c0[1] = fVar166 * fVar13;
                local_11c0[2] = fVar167 * fVar14;
                local_11c0[3] = fVar168 * fVar15;
                fStack_11b0 = fVar169 * fVar16;
                fStack_11ac = fVar170 * fVar17;
                fStack_11a8 = fVar171 * fVar18;
                uStack_11a4 = local_1220._28_4_;
                local_11a0[0] = fVar12 * fVar71;
                local_11a0[1] = fVar13 * fVar108;
                local_11a0[2] = fVar14 * fVar114;
                local_11a0[3] = fVar15 * fVar115;
                fStack_1190 = fVar16 * fVar116;
                fStack_118c = fVar17 * fVar117;
                fStack_1188 = fVar18 * fVar118;
                uStack_1184 = local_1280._28_4_;
                auVar93 = vpmovzxwd_avx(auVar72);
                auVar73._0_16_ = vpslld_avx(auVar93,0x1f);
                auVar93 = vpunpckhwd_avx(auVar72,auVar72);
                auVar93 = vpslld_avx(auVar93,0x1f);
                auVar73._16_16_ = auVar93;
                auVar97._8_4_ = 0x7f800000;
                auVar97._0_8_ = 0x7f8000007f800000;
                auVar97._12_4_ = 0x7f800000;
                auVar97._16_4_ = 0x7f800000;
                auVar97._20_4_ = 0x7f800000;
                auVar97._24_4_ = 0x7f800000;
                auVar97._28_4_ = 0x7f800000;
                auVar79 = vblendvps_avx(auVar97,_local_14c0,auVar73);
                auVar94 = vshufps_avx(auVar79,auVar79,0xb1);
                auVar94 = vminps_avx(auVar79,auVar94);
                auVar22 = vshufpd_avx(auVar94,auVar94,5);
                auVar94 = vminps_avx(auVar94,auVar22);
                auVar22 = vperm2f128_avx(auVar94,auVar94,1);
                auVar94 = vminps_avx(auVar94,auVar22);
                auVar79 = vcmpps_avx(auVar79,auVar94,0);
                auVar93 = vpackssdw_avx(auVar79._0_16_,auVar79._16_16_);
                auVar72 = vpand_avx(auVar93,auVar72);
                auVar93 = vpmovzxwd_avx(auVar72);
                auVar93 = vpslld_avx(auVar93,0x1f);
                auVar93 = vpsrad_avx(auVar93,0x1f);
                auVar72 = vpunpckhwd_avx(auVar72,auVar72);
                auVar72 = vpslld_avx(auVar72,0x1f);
                auVar72 = vpsrad_avx(auVar72,0x1f);
                auVar74._16_16_ = auVar72;
                auVar74._0_16_ = auVar93;
                if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar74 >> 0x7f,0) == '\0') &&
                      (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar72 >> 0x3f,0) == '\0') &&
                    (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar72[0xf]) {
                  auVar74 = local_1260;
                }
                uVar59 = vmovmskps_avx(auVar74);
                uVar60 = 0;
                if (uVar59 != 0) {
                  for (; (uVar59 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                  }
                }
                local_14f8 = pSVar68;
                local_1080 = auVar110;
                local_1040 = auVar28;
                do {
                  uVar69 = (ulong)uVar60;
                  uVar60 = *(uint *)((long)&local_fc0 + uVar69 * 4);
                  pGVar9 = (pSVar68->geometries).items[uVar60].ptr;
                  if ((pGVar9->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1400 + uVar69 * 4) = 0;
                  }
                  else {
                    pRVar10 = context->args;
                    if ((pRVar10->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar12 = *(float *)(local_1240 + uVar69 * 4);
                      fVar13 = *(float *)(local_1220 + uVar69 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1200 + uVar69 * 4);
                      (ray->Ng).field_0.field_0.x = local_11e0[uVar69];
                      (ray->Ng).field_0.field_0.y = local_11c0[uVar69];
                      (ray->Ng).field_0.field_0.z = local_11a0[uVar69];
                      ray->u = fVar12;
                      ray->v = fVar13;
                      ray->primID = *(uint *)((long)&local_1340 + uVar69 * 4);
                      ray->geomID = uVar60;
                      pRVar11 = context->user;
                      ray->instID[0] = pRVar11->instID[0];
                      ray->instPrimID[0] = pRVar11->instPrimID[0];
                      unaff_R12 = local_1500;
                      break;
                    }
                    local_14f0.context = context->user;
                    local_1470 = local_11e0[uVar69];
                    local_146c = local_11c0[uVar69];
                    local_1468 = local_11a0[uVar69];
                    local_1464 = *(undefined4 *)(local_1240 + uVar69 * 4);
                    local_1460 = *(undefined4 *)(local_1220 + uVar69 * 4);
                    local_145c = *(undefined4 *)((long)&local_1340 + uVar69 * 4);
                    local_1458 = uVar60;
                    local_1454 = (local_14f0.context)->instID[0];
                    local_1450 = (local_14f0.context)->instPrimID[0];
                    local_1420 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1200 + uVar69 * 4);
                    local_1504 = -1;
                    local_14f0.valid = &local_1504;
                    local_14f0.geometryUserPtr = pGVar9->userPtr;
                    local_14f0.ray = (RTCRayN *)ray;
                    local_14f0.hit = (RTCHitN *)&local_1470;
                    local_14f0.N = 1;
                    if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_012bae7d:
                      if (pRVar10->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                          (*pRVar10->filter)(&local_14f0);
                        }
                        if (*local_14f0.valid == 0) goto LAB_012baf82;
                      }
                      (((Vec3f *)((long)local_14f0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_14f0.hit;
                      (((Vec3f *)((long)local_14f0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_14f0.hit + 4);
                      (((Vec3f *)((long)local_14f0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_14f0.hit + 8);
                      *(float *)((long)local_14f0.ray + 0x3c) = *(float *)(local_14f0.hit + 0xc);
                      *(float *)((long)local_14f0.ray + 0x40) = *(float *)(local_14f0.hit + 0x10);
                      *(float *)((long)local_14f0.ray + 0x44) = *(float *)(local_14f0.hit + 0x14);
                      *(float *)((long)local_14f0.ray + 0x48) = *(float *)(local_14f0.hit + 0x18);
                      *(float *)((long)local_14f0.ray + 0x4c) = *(float *)(local_14f0.hit + 0x1c);
                      *(float *)((long)local_14f0.ray + 0x50) = *(float *)(local_14f0.hit + 0x20);
                    }
                    else {
                      local_1440 = lVar64;
                      (*pGVar9->intersectionFilterN)(&local_14f0);
                      lVar64 = local_1440;
                      if (*local_14f0.valid != 0) goto LAB_012bae7d;
LAB_012baf82:
                      (ray->super_RayK<1>).tfar = local_1420;
                    }
                    *(undefined4 *)(local_1400 + uVar69 * 4) = 0;
                    fVar12 = (ray->super_RayK<1>).tfar;
                    auVar75._4_4_ = fVar12;
                    auVar75._0_4_ = fVar12;
                    auVar75._8_4_ = fVar12;
                    auVar75._12_4_ = fVar12;
                    auVar75._16_4_ = fVar12;
                    auVar75._20_4_ = fVar12;
                    auVar75._24_4_ = fVar12;
                    auVar75._28_4_ = fVar12;
                    auVar79 = vcmpps_avx(_local_14c0,auVar75,2);
                    local_1400 = vandps_avx(auVar79,local_1400);
                    unaff_R12 = local_1500;
                  }
                  pSVar68 = local_14f8;
                  if ((((((((local_1400 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_1400 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_1400 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_1400 >> 0x7f,0) == '\0') &&
                        (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_1400 >> 0xbf,0) == '\0') &&
                      (local_1400 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_1400[0x1f]) break;
                  BVHNIntersector1<4,1,true,embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,true>>>
                  ::intersect(&local_14f0);
                  uVar60 = (uint)local_14f0.valid;
                } while( true );
              }
            }
            lVar64 = lVar64 + 1;
          } while (lVar64 != local_1490);
        }
        fVar12 = (ray->super_RayK<1>).tfar;
        auVar76 = ZEXT1664(CONCAT412(fVar12,CONCAT48(fVar12,CONCAT44(fVar12,fVar12))));
        auVar145 = ZEXT1664(local_1350);
        auVar149 = ZEXT1664(local_1360);
        auVar165 = ZEXT1664(local_1370);
        auVar174 = ZEXT1664(local_1380);
        auVar177 = ZEXT1664(local_1390);
        auVar187 = ZEXT1664(local_13a0);
        auVar201 = ZEXT1664(local_13b0);
        auVar203 = ZEXT1664(local_13c0);
        auVar207 = ZEXT1664(local_13d0);
        auVar136 = ZEXT1664(local_13e0);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }